

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O2

DdNode * cuddUniqueConst(DdManager *unique,double value)

{
  uint *puVar1;
  uint uVar2;
  DdNode *pDVar3;
  DdNode **ppDVar4;
  DdNode **ppDVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  uVar2 = (unique->constants).keys;
  if ((unique->constants).maxKeys < uVar2) {
    if ((unique->gcEnabled == 0) ||
       ((unique->dead <= unique->minDead && ((unique->constants).dead * 10 <= uVar2 * 9)))) {
      cuddRehash(unique,0x7fffffff);
    }
    else {
      cuddGarbageCollect(unique,1);
    }
  }
  dVar8 = (double)(~-(ulong)(value < 1e+151) & 0x7ea2aa4f4a405be2 |
                  (~-(ulong)(value <= -1e+151) & (ulong)value |
                  -(ulong)(value <= -1e+151) & 0xfea2aa4f4a405be2) & -(ulong)(value < 1e+151));
  dVar6 = -dVar8;
  if (-dVar8 <= dVar8) {
    dVar6 = dVar8;
  }
  dVar8 = (double)(~-(ulong)(dVar6 < unique->epsilon) & (ulong)dVar8);
  ppDVar5 = (unique->constants).nodelist +
            (int)((uint)(((int)((ulong)dVar8 >> 0x20) + SUB84(dVar8,0) * 0xc00005) * 0x40f1f9) >>
                 ((byte)(unique->constants).shift & 0x1f));
  ppDVar4 = ppDVar5;
  while( true ) {
    pDVar3 = *ppDVar4;
    if (pDVar3 == (DdNode *)0x0) {
      unique->keys = unique->keys + 1;
      puVar1 = &(unique->constants).keys;
      *puVar1 = *puVar1 + 1;
      pDVar3 = cuddAllocNode(unique);
      if (pDVar3 == (DdNode *)0x0) {
        pDVar3 = (DdNode *)0x0;
      }
      else {
        pDVar3->index = 0x7fffffff;
        (pDVar3->type).value = dVar8;
        pDVar3->next = *ppDVar5;
        *ppDVar5 = pDVar3;
      }
      return pDVar3;
    }
    dVar6 = (pDVar3->type).value;
    if ((dVar6 == dVar8) && (!NAN(dVar6) && !NAN(dVar8))) break;
    dVar6 = dVar6 - dVar8;
    dVar7 = -dVar6;
    if (-dVar6 <= dVar6) {
      dVar7 = dVar6;
    }
    if (dVar7 < unique->epsilon) break;
    ppDVar4 = &pDVar3->next;
  }
  if (pDVar3->ref != 0) {
    return pDVar3;
  }
  cuddReclaim(unique,pDVar3);
  return pDVar3;
}

Assistant:

DdNode *
cuddUniqueConst(
  DdManager * unique,
  CUDD_VALUE_TYPE  value)
{
    int pos;
    DdNodePtr *nodelist;
    DdNode *looking;
    hack split;

#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps++;
#endif

    if (unique->constants.keys > unique->constants.maxKeys) {
        if (unique->gcEnabled && ((unique->dead > unique->minDead) ||
        (10 * unique->constants.dead > 9 * unique->constants.keys))) {  /* too many dead */
            (void) cuddGarbageCollect(unique,1);
        } else {
            cuddRehash(unique,CUDD_CONST_INDEX);
        }
    }

    cuddAdjust(value); /* for the case of crippled infinities */

    if (ddAbs(value) < unique->epsilon) {
        value = 0.0;
    }
    split.value = value;

    pos = ddHash(split.bits[0], split.bits[1], unique->constants.shift);
    nodelist = unique->constants.nodelist;
    looking = nodelist[pos];

    /* Here we compare values both for equality and for difference less
     * than epsilon. The first comparison is required when values are
     * infinite, since Infinity - Infinity is NaN and NaN < X is 0 for
     * every X.
     */
    while (looking != NULL) {
        if (looking->type.value == value ||
        ddEqualVal(looking->type.value,value,unique->epsilon)) {
            if (looking->ref == 0) {
                cuddReclaim(unique,looking);
            }
            return(looking);
        }
        looking = looking->next;
#ifdef DD_UNIQUE_PROFILE
        unique->uniqueLinks++;
#endif
    }

    unique->keys++;
    unique->constants.keys++;

    looking = cuddAllocNode(unique);
    if (looking == NULL) return(NULL);
    looking->index = CUDD_CONST_INDEX;
    looking->type.value = value;
    looking->next = nodelist[pos];
    nodelist[pos] = looking;

    return(looking);

}